

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldsWithPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UVector *patternItems,
          UBool forceSingleHourDigit,int32_t *hour,int32_t *min,int32_t *sec)

{
  UBool UVar1;
  int8_t iVar2;
  uint8_t maxDigits_00;
  int32_t iVar3;
  FieldType FVar4;
  int32_t iVar5;
  UChar32 c;
  int iVar6;
  GMTOffsetField *this_00;
  uint8_t maxDigits;
  uint uStack_7c;
  uint16_t __c2;
  int32_t chLen;
  UChar32 ch;
  UChar *patStr;
  FieldType fieldType;
  GMTOffsetField *field;
  int local_58;
  int32_t len;
  int32_t i;
  int32_t idx;
  int32_t offsetS;
  int32_t offsetM;
  int32_t offsetH;
  UBool failed;
  int32_t *hour_local;
  UVector *pUStack_30;
  UBool forceSingleHourDigit_local;
  UVector *patternItems_local;
  UnicodeString *pUStack_20;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  offsetM._3_1_ = '\0';
  i = 0;
  idx = 0;
  offsetS = 0;
  local_58 = 0;
  len = start;
  _offsetH = hour;
  hour_local._7_1_ = forceSingleHourDigit;
  pUStack_30 = patternItems;
  patternItems_local._4_4_ = start;
  pUStack_20 = text;
  text_local = (UnicodeString *)this;
  do {
    iVar6 = local_58;
    iVar3 = UVector::size(pUStack_30);
    if (iVar3 <= iVar6) {
LAB_0023c7ef:
      if (offsetM._3_1_ == '\0') {
        *_offsetH = offsetS;
        *min = idx;
        *sec = i;
        this_local._4_4_ = len - patternItems_local._4_4_;
      }
      else {
        *sec = 0;
        *min = 0;
        *_offsetH = 0;
        this_local._4_4_ = 0;
      }
      return this_local._4_4_;
    }
    field._4_4_ = 0;
    this_00 = (GMTOffsetField *)UVector::elementAt(pUStack_30,local_58);
    FVar4 = GMTOffsetField::getType(this_00);
    if (FVar4 == TEXT) {
      _chLen = GMTOffsetField::getPatternText(this_00);
      field._4_4_ = u_strlen_63(_chLen);
      iVar3 = len;
      if ((local_58 == 0) && (iVar5 = UnicodeString::length(pUStack_20), iVar3 < iVar5)) {
        c = UnicodeString::char32At(pUStack_20,len);
        UVar1 = PatternProps::isWhiteSpace(c);
        if (UVar1 == '\0') {
          for (; 0 < field._4_4_; field._4_4_ = field._4_4_ - iVar6) {
            uStack_7c = (uint)(ushort)*_chLen;
            if (((((uStack_7c & 0xfffff800) == 0xd800) && ((*_chLen & 0x400U) == 0)) &&
                (field._4_4_ != 1)) && ((_chLen[1] & 0xfc00U) == 0xdc00)) {
              uStack_7c = uStack_7c * 0x400 + (uint)(ushort)_chLen[1] + 0xfca02400;
            }
            UVar1 = PatternProps::isWhiteSpace(uStack_7c);
            if (UVar1 == '\0') break;
            iVar6 = 2;
            if (uStack_7c < 0x10000) {
              iVar6 = 1;
            }
            _chLen = _chLen + iVar6;
          }
        }
      }
      iVar2 = UnicodeString::caseCompare(pUStack_20,len,field._4_4_,_chLen,0);
      if (iVar2 != '\0') {
        offsetM._3_1_ = '\x01';
        goto LAB_0023c7ef;
      }
      len = field._4_4_ + len;
    }
    else {
      if (FVar4 == HOUR) {
        maxDigits_00 = '\x02';
        if (hour_local._7_1_ != '\0') {
          maxDigits_00 = '\x01';
        }
        offsetS = parseOffsetFieldWithLocalizedDigits
                            (this,pUStack_20,len,'\x01',maxDigits_00,0,0x17,
                             (int32_t *)((long)&field + 4));
      }
      else if (FVar4 == MINUTE) {
        idx = parseOffsetFieldWithLocalizedDigits
                        (this,pUStack_20,len,'\x02','\x02',0,0x3b,(int32_t *)((long)&field + 4));
      }
      else if (FVar4 == SECOND) {
        i = parseOffsetFieldWithLocalizedDigits
                      (this,pUStack_20,len,'\x02','\x02',0,0x3b,(int32_t *)((long)&field + 4));
      }
      if (field._4_4_ == 0) {
        offsetM._3_1_ = '\x01';
        goto LAB_0023c7ef;
      }
      len = field._4_4_ + len;
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldsWithPattern(const UnicodeString& text, int32_t start,
        UVector* patternItems, UBool forceSingleHourDigit, int32_t& hour, int32_t& min, int32_t& sec) const {
    UBool failed = FALSE;
    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;
    int32_t idx = start;

    for (int32_t i = 0; i < patternItems->size(); i++) {
        int32_t len = 0;
        const GMTOffsetField* field = (const GMTOffsetField*)patternItems->elementAt(i);
        GMTOffsetField::FieldType fieldType = field->getType();
        if (fieldType == GMTOffsetField::TEXT) {
            const UChar* patStr = field->getPatternText();
            len = u_strlen(patStr);
            if (i == 0) {
                // When TimeZoneFormat parse() is called from SimpleDateFormat,
                // leading space characters might be truncated. If the first pattern text
                // starts with such character (e.g. Bidi control), then we need to
                // skip the leading space charcters.
                if (idx < text.length() && !PatternProps::isWhiteSpace(text.char32At(idx))) {
                    while (len > 0) {
                        UChar32 ch;
                        int32_t chLen;
                        U16_GET(patStr, 0, 0, len, ch)
                        if (PatternProps::isWhiteSpace(ch)) {
                            chLen = U16_LENGTH(ch);
                            len -= chLen;
                            patStr += chLen;
                        }
                        else {
                            break;
                        }
                    }
                }
            }
            if (text.caseCompare(idx, len, patStr, 0) != 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        } else {
            if (fieldType == GMTOffsetField::HOUR) {
                uint8_t maxDigits = forceSingleHourDigit ? 1 : 2;
                offsetH = parseOffsetFieldWithLocalizedDigits(text, idx, 1, maxDigits, 0, MAX_OFFSET_HOUR, len);
            } else if (fieldType == GMTOffsetField::MINUTE) {
                offsetM = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            } else if (fieldType == GMTOffsetField::SECOND) {
                offsetS = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_SECOND, len);
            }

            if (len == 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        }
    }

    if (failed) {
        hour = min = sec = 0;
        return 0;
    }

    hour = offsetH;
    min = offsetM;
    sec = offsetS;

    return idx - start;
}